

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_decode.c
# Opt level: O0

int smf_event_is_system_realtime(smf_event_t *event)

{
  int iVar1;
  smf_event_t *event_local;
  
  if (event->midi_buffer == (uchar *)0x0) {
    __assert_fail("event->midi_buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_decode.c"
                  ,0x44,"int smf_event_is_system_realtime(const smf_event_t *)");
  }
  if (0 < event->midi_buffer_length) {
    iVar1 = smf_event_is_metadata(event);
    if (iVar1 == 0) {
      if (*event->midi_buffer < 0xf8) {
        event_local._4_4_ = 0;
      }
      else {
        event_local._4_4_ = 1;
      }
    }
    else {
      event_local._4_4_ = 0;
    }
    return event_local._4_4_;
  }
  __assert_fail("event->midi_buffer_length > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_decode.c"
                ,0x45,"int smf_event_is_system_realtime(const smf_event_t *)");
}

Assistant:

int
smf_event_is_system_realtime(const smf_event_t *event)
{
	assert(event->midi_buffer);
	assert(event->midi_buffer_length > 0);

	if (smf_event_is_metadata(event))
		return (0);
	
	if (event->midi_buffer[0] >= 0xF8)
		return (1);

	return (0);
}